

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharContent.h
# Opt level: O3

void __thiscall CharContent::CharContent(CharContent *this,CharContent *cc)

{
  ulong __n;
  char *__s;
  
  this->_vptr_CharContent = (_func_int **)&PTR__CharContent_00117c48;
  this->npos = 0xffffffffffffffff;
  __n = cc->m_length;
  __s = (char *)operator_new__(__n);
  this->m = __s;
  this->size = cc->size;
  this->m_length = __n;
  memset(__s,0,__n);
  memmove(__s,cc->m,__n);
  return;
}

Assistant:

CharContent(const CharContent &cc){
        size_t n=cc.m_length;
        m=new char [n];
        size=cc.size;
        m_length=cc.m_length;
        memset(m,'\0',m_length);
        memmove(m,cc.m,cc.m_length);
    }